

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_username.c
# Opt level: O0

char * get_username(void)

{
  __uid_t __uid;
  passwd *ppVar1;
  char *pcVar2;
  char *local_30;
  char *ret;
  char *user;
  passwd *ppStack_18;
  uid_t uid;
  passwd *p;
  
  __uid = getuid();
  local_30 = getlogin();
  setpwent();
  if (local_30 == (char *)0x0) {
    ppStack_18 = (passwd *)0x0;
  }
  else {
    ppStack_18 = getpwnam(local_30);
  }
  if ((ppStack_18 == (passwd *)0x0) || (ppStack_18->pw_uid != __uid)) {
    ppVar1 = getpwuid(__uid);
    if (ppVar1 == (passwd *)0x0) {
      return (char *)0x0;
    }
    local_30 = ppVar1->pw_name;
  }
  endpwent();
  pcVar2 = dupstr(local_30);
  return pcVar2;
}

Assistant:

char *get_username(void)
{
    struct passwd *p;
    uid_t uid = getuid();
    char *user, *ret = NULL;

    /*
     * First, find who we think we are using getlogin. If this
     * agrees with our uid, we'll go along with it. This should
     * allow sharing of uids between several login names whilst
     * coping correctly with people who have su'ed.
     */
    user = getlogin();
#if HAVE_SETPWENT
    setpwent();
#endif
    if (user)
        p = getpwnam(user);
    else
        p = NULL;
    if (p && p->pw_uid == uid) {
        /*
         * The result of getlogin() really does correspond to
         * our uid. Fine.
         */
        ret = user;
    } else {
        /*
         * If that didn't work, for whatever reason, we'll do
         * the simpler version: look up our uid in the password
         * file and map it straight to a name.
         */
        p = getpwuid(uid);
        if (!p)
            return NULL;
        ret = p->pw_name;
    }
#if HAVE_ENDPWENT
    endpwent();
#endif

    return dupstr(ret);
}